

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O3

subiter_type * __thiscall
gnuplotio::
VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>
::deref_subiter(subiter_type *__return_storage_ptr__,
               VecOfRange<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>
               *this)

{
  pointer pIVar1;
  ulong uVar2;
  long lVar3;
  subiter_type sVar4;
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  subvec;
  allocator_type local_39;
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  local_38;
  
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  ::vector(&local_38,
           (long)(this->rvec).
                 super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->rvec).
                 super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4,&local_39);
  pIVar1 = (this->rvec).
           super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rvec).
      super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      sVar4 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
              ::deref_subiter((IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>
                               *)((long)&(pIVar1->it)._M_current + lVar3));
      *(int **)((long)&((local_38.
                         super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->it)._M_current + lVar3) =
           sVar4.it._M_current._M_current;
      *(int **)((long)&((local_38.
                         super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->end)._M_current + lVar3) =
           sVar4.end._M_current._M_current;
      uVar2 = uVar2 + 1;
      pIVar1 = (this->rvec).
               super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x10;
    } while (uVar2 < (ulong)((long)(this->rvec).
                                   super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1 >> 4));
  }
  std::
  vector<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
  ::vector(&__return_storage_ptr__->rvec,&local_38);
  if (local_38.
      super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>,_std::allocator<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

subiter_type deref_subiter() const {
        std::vector<typename RT::subiter_type> subvec(rvec.size());
        for(size_t i=0; i<rvec.size(); i++) {
            subvec[i] = rvec[i].deref_subiter();
        }
        return subiter_type(subvec);
    }